

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStructBody
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  pointer pcVar2;
  Type type;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined2 uVar5;
  undefined6 uVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_type *psVar11;
  Type *type_00;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  pointer ppFVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  CodeWriter *local_e8;
  KotlinGenerator *local_e0;
  char *local_d8;
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  IdlNamer *local_70;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_68;
  string local_50;
  
  _Var13._M_p = (pointer)&local_118;
  local_e8 = writer;
  local_e0 = this;
  local_d8 = nameprefix;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffed8,"align","");
  NumToString<unsigned_long>(&local_108,struct_def->minalign);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != &local_118) {
    operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
  }
  _Var13._M_p = (pointer)&local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffed8,"size","");
  NumToString<unsigned_long>(&local_108,struct_def->bytesize);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var13._M_p != &local_118) {
    operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"builder.prep({{align}}, {{size}})","");
  CodeWriter::operator+=(local_e8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_68,&(struct_def->fields).vec);
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_70 = &local_e0->namer_;
    ppFVar14 = local_68.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pFVar1 = ppFVar14[-1];
      if (pFVar1->padding != 0) {
        _Var13._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffed8,"pad","")
        ;
        NumToString<unsigned_long>(&local_108,pFVar1->padding);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_118) {
          operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"builder.pad({{pad}})","");
        CodeWriter::operator+=(local_e8,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (pFVar1->value).type.struct_def, struct_def_00->fixed == true)) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        pcVar2 = (pFVar1->super_Definition).name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar2,
                   pcVar2 + (pFVar1->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_108);
        pcVar7 = local_d8;
        strlen(local_d8);
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_108,0,(char *)0x0,(ulong)pcVar7);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 == paVar10) {
          local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_118._8_8_ = plVar9[3];
          _Var13._M_p = (pointer)&local_118;
        }
        else {
          local_118._M_allocated_capacity = paVar10->_M_allocated_capacity;
          _Var13._M_p = (pointer)*plVar9;
        }
        *plVar9 = (long)paVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        GenStructBody(local_e0,struct_def_00,local_e8,_Var13._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_118) {
          operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
        }
        uVar12 = local_108.field_2._M_allocated_capacity;
        _Var13._M_p = local_108._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_001e8d2b:
          operator_delete(_Var13._M_p,uVar12 + 1);
        }
      }
      else {
        _Var13._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffed8,"type","");
        GenMethod_abi_cxx11_(&local_108,(KotlinGenerator *)&pFVar1->value,type_00);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_118) {
          operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
        }
        _Var13._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffed8,"argname","");
        (*(local_70->super_Namer)._vptr_Namer[7])(local_b0,local_70,pFVar1);
        pcVar7 = local_d8;
        strlen(local_d8);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,(ulong)pcVar7);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_108.field_2._M_allocated_capacity = *psVar11;
          local_108.field_2._8_8_ = plVar9[3];
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar11;
          local_108._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_108._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_118) {
          operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
        }
        _Var13._M_p = (pointer)&local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffed8,"cast","");
        uVar3 = (pFVar1->value).type.struct_def;
        uVar4 = (pFVar1->value).type.enum_def;
        uVar5 = (pFVar1->value).type.fixed_length;
        uVar6 = *(undefined6 *)&(pFVar1->value).type.field_0x1a;
        type.enum_def._2_6_ = uVar6;
        type.enum_def._0_2_ = uVar5;
        type.struct_def = (StructDef *)uVar4;
        type._0_8_ = uVar3;
        type._24_8_ = _Var13._M_p;
        CastToSigned_abi_cxx11_(type);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8->value_map_,(key_type *)&stack0xfffffffffffffed8);
        std::__cxx11::string::_M_assign((string *)pmVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var13._M_p != &local_118) {
          operator_delete(_Var13._M_p,local_118._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"builder.put{{type}}({{argname}}{{cast}})","");
        CodeWriter::operator+=(local_e8,&local_d0);
        uVar12 = local_d0.field_2._M_allocated_capacity;
        _Var13._M_p = local_d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_001e8d2b;
      }
      ppFVar14 = ppFVar14 + -1;
    } while (ppFVar14 !=
             local_68.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname", nameprefix + namer_.Variable(field));
        writer.SetValue("cast", CastToSigned(field.value.type));
        writer += "builder.put{{type}}({{argname}}{{cast}})";
      }
    }
  }